

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest::BasicAuthIntegrationTest
          (BasicAuthIntegrationTest *this)

{
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  IntegrationTest::IntegrationTest(&this->super_IntegrationTest);
  (this->super_IntegrationTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BasicAuthIntegrationTest_00185230;
  std::__cxx11::string::string((string *)&this->counter_name_,"example_total",&local_21);
  std::__cxx11::string::string((string *)&this->username_,"test_user",&local_22);
  std::__cxx11::string::string((string *)&this->password_,"test_password",&local_23);
  (this->registry_).super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->registry_).super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

void SetUp() override {
    IntegrationTest::SetUp();

    registry_ = RegisterSomeCounter(counter_name_, default_metrics_path_);

    exposer_->RegisterAuth(
        [&](const std::string& user, const std::string& password) {
          return user == username_ && password == password_;
        },
        "Some Auth Realm", default_metrics_path_);
  }